

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

double deqp::gles31::Functional::FmaCase::fma(double __x,double __y,double __z)

{
  FloatFormat *this;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  deRoundingMode dVar4;
  int in_ESI;
  Interval *in_RDI;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_238;
  double local_228;
  Interval ib;
  Interval ia;
  double local_1e8;
  double local_1d8;
  double local_1c8;
  Interval ic;
  Interval local_180;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  Interval local_110;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  Interval local_d8;
  Interval local_c0;
  FloatFormat local_a8 [3];
  
  tcu::FloatFormat::FloatFormat(local_a8,0,0,7,false,YES,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(local_a8 + 1,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(local_a8 + 2,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
  ib.m_hasNaN = NAN(SUB84(__x,0));
  dVar12 = (double)SUB84(__x,0);
  local_228 = INFINITY;
  ib.m_lo = INFINITY;
  if (!ib.m_hasNaN) {
    ib.m_lo = dVar12;
  }
  this = local_a8 + in_ESI;
  local_238 = -INFINITY;
  ib.m_hi = -INFINITY;
  if (!ib.m_hasNaN) {
    ib.m_hi = dVar12;
  }
  tcu::FloatFormat::convert(&ia,this,&ib);
  ic.m_hasNaN = NAN(SUB84(__y,0));
  ic.m_lo = INFINITY;
  ic.m_hi = -INFINITY;
  if (!ic.m_hasNaN) {
    ic.m_lo = (double)SUB84(__y,0);
    ic.m_hi = ic.m_lo;
  }
  tcu::FloatFormat::convert(&ib,this,&ic);
  local_180.m_hasNaN = NAN(SUB84(__z,0));
  if (!local_180.m_hasNaN) {
    local_238 = (double)SUB84(__z,0);
    local_228 = local_238;
  }
  local_180.m_lo = local_228;
  local_180.m_hi = local_238;
  tcu::FloatFormat::convert(&ic,this,&local_180);
  local_180.m_hasNaN = false;
  local_180.m_lo = INFINITY;
  local_180.m_hi = -INFINITY;
  dVar4 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar13 = ia.m_lo;
  dVar12 = ib.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar13 = dVar13 * dVar12;
  bVar3 = NAN(dVar13);
  local_1e8 = -INFINITY;
  local_e8 = -INFINITY;
  if (!bVar3) {
    local_e8 = dVar13;
  }
  uStack_e0 = 0;
  local_1c8 = INFINITY;
  local_f8 = INFINITY;
  if (!bVar3) {
    local_f8 = dVar13;
  }
  uStack_f0 = 0;
  dVar12 = ia.m_lo * ib.m_lo;
  if (!NAN(dVar12)) {
    local_1e8 = dVar12;
    local_1c8 = dVar12;
  }
  deSetRoundingMode(dVar4);
  dVar4 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar9 = ia.m_lo;
  dVar13 = ib.m_hi;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar9 = dVar9 * dVar13;
  local_128 = -INFINITY;
  if (!NAN(dVar9)) {
    local_128 = dVar9;
  }
  uStack_120 = 0;
  local_138 = ia.m_lo * ib.m_hi;
  uStack_130 = 0;
  local_148 = INFINITY;
  if (!NAN(local_138)) {
    local_148 = local_138;
  }
  uStack_140 = 0;
  deSetRoundingMode(dVar4);
  dVar4 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar10 = ia.m_hi;
  dVar13 = ib.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar10 = dVar10 * dVar13;
  local_1d8 = -INFINITY;
  if (!NAN(dVar10)) {
    local_1d8 = dVar10;
  }
  local_168 = ia.m_hi * ib.m_lo;
  uStack_160 = 0;
  local_158 = INFINITY;
  if (!NAN(local_168)) {
    local_158 = local_168;
  }
  uStack_150 = 0;
  deSetRoundingMode(dVar4);
  dVar4 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar22 = ia.m_hi;
  dVar18 = ib.m_hi;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar21 = ia.m_hi;
  dVar19 = ib.m_hi;
  deSetRoundingMode(dVar4);
  dVar16 = (double)(-(ulong)NAN(dVar9) & 0x7ff0000000000000 | ~-(ulong)NAN(dVar9) & (ulong)dVar9);
  dVar20 = (double)(~-(ulong)NAN(local_138) & (ulong)local_138 |
                   -(ulong)NAN(local_138) & 0xfff0000000000000);
  uVar5 = -(ulong)(dVar16 <= local_148);
  uVar6 = -(ulong)(dVar20 <= local_128);
  dVar17 = (double)(-(ulong)NAN(dVar10) & 0x7ff0000000000000 | ~-(ulong)NAN(dVar10) & (ulong)dVar10)
  ;
  dVar13 = (double)(~-(ulong)NAN(local_168) & (ulong)local_168 |
                   -(ulong)NAN(local_168) & 0xfff0000000000000);
  uVar7 = -(ulong)(dVar17 <= local_158);
  uVar8 = -(ulong)(dVar13 <= local_1d8);
  dVar22 = dVar22 * dVar18;
  bVar1 = NAN(dVar22);
  dVar18 = -INFINITY;
  if (!bVar1) {
    dVar18 = dVar22;
  }
  dVar14 = (double)(~-(ulong)(local_f8 <= local_1c8) & (ulong)local_1c8 |
                   (ulong)local_f8 & -(ulong)(local_f8 <= local_1c8));
  dVar11 = (double)(~-(ulong)(local_1e8 <= local_e8) & (ulong)local_1e8 |
                   (ulong)local_e8 & -(ulong)(local_1e8 <= local_e8));
  dVar15 = (double)(~uVar5 & (ulong)local_148 | uVar5 & (ulong)dVar16);
  dVar16 = (double)(~uVar6 & (ulong)dVar20 | (ulong)local_128 & uVar6);
  dVar17 = (double)(~uVar7 & (ulong)local_158 | uVar7 & (ulong)dVar17);
  dVar13 = (double)(~uVar8 & (ulong)dVar13 | (ulong)local_1d8 & uVar8);
  dVar21 = dVar21 * dVar19;
  dVar20 = INFINITY;
  if (!bVar1) {
    dVar20 = dVar22;
  }
  bVar2 = NAN(dVar21);
  dVar19 = -INFINITY;
  if (!bVar2) {
    dVar19 = dVar21;
  }
  dVar18 = (double)(~-(ulong)(dVar19 <= dVar18) & (ulong)dVar19 |
                   (ulong)dVar18 & -(ulong)(dVar19 <= dVar18));
  dVar19 = INFINITY;
  if (!bVar2) {
    dVar19 = dVar21;
  }
  dVar19 = (double)(~-(ulong)(dVar20 <= dVar19) & (ulong)dVar19 |
                   (ulong)dVar20 & -(ulong)(dVar20 <= dVar19));
  uVar5 = -(ulong)(dVar14 <= dVar15);
  dVar20 = (double)(~uVar5 & (ulong)dVar15 | uVar5 & (ulong)dVar14);
  uVar5 = -(ulong)(dVar16 <= dVar11);
  dVar16 = (double)(~uVar5 & (ulong)dVar16 | uVar5 & (ulong)dVar11);
  uVar5 = -(ulong)(dVar20 <= dVar17);
  dVar20 = (double)(~uVar5 & (ulong)dVar17 | uVar5 & (ulong)dVar20);
  uVar5 = -(ulong)(dVar13 <= dVar16);
  dVar13 = (double)(~uVar5 & (ulong)dVar13 | uVar5 & (ulong)dVar16);
  local_110.m_hasNaN =
       (bVar1 || bVar2) ||
       (((NAN(local_138) || NAN(dVar10)) || NAN(local_168)) ||
       ((bVar3 || NAN(dVar12)) || NAN(dVar9)));
  uVar5 = -(ulong)(dVar20 <= dVar19);
  local_110.m_lo = (double)(uVar5 & (ulong)dVar20 | ~uVar5 & (ulong)dVar19);
  uVar5 = -(ulong)(dVar18 <= dVar13);
  local_110.m_hi = (double)(uVar5 & (ulong)dVar13 | ~uVar5 & (ulong)dVar18);
  bVar3 = false;
  if ((ia.m_lo != -INFINITY) && (ia.m_hi != INFINITY)) {
    bVar3 = ib.m_hi != INFINITY && ib.m_lo != -INFINITY;
  }
  tcu::FloatFormat::roundOut(&local_c0,this,&local_110,bVar3);
  tcu::FloatFormat::convert(&local_d8,this,&local_c0);
  dVar4 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar12 = ic.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar12 = dVar12 + local_d8.m_lo;
  local_180.m_hasNaN = NAN(dVar12);
  dVar13 = -INFINITY;
  if (!local_180.m_hasNaN) {
    dVar13 = dVar12;
  }
  dVar9 = INFINITY;
  if (!local_180.m_hasNaN) {
    dVar9 = dVar12;
  }
  dVar16 = ic.m_hi + local_d8.m_hi;
  dVar12 = INFINITY;
  dVar10 = -INFINITY;
  if (!NAN(dVar16)) {
    dVar12 = dVar16;
    dVar10 = dVar16;
  }
  local_180.m_hasNaN = local_180.m_hasNaN || NAN(dVar16);
  local_180.m_lo =
       (double)(~-(ulong)(dVar9 <= dVar12) & (ulong)dVar12 |
               (ulong)dVar9 & -(ulong)(dVar9 <= dVar12));
  local_180.m_hi =
       (double)(~-(ulong)(dVar10 <= dVar13) & (ulong)dVar10 |
               (ulong)dVar13 & -(ulong)(dVar10 <= dVar13));
  deSetRoundingMode(dVar4);
  bVar3 = false;
  if ((local_d8.m_lo != -INFINITY) && (local_d8.m_hi != INFINITY)) {
    bVar3 = ic.m_hi != INFINITY && ic.m_lo != -INFINITY;
  }
  tcu::FloatFormat::roundOut(&local_d8,this,&local_180,bVar3);
  tcu::FloatFormat::convert(in_RDI,this,&local_d8);
  return extraout_XMM0_Qa;
}

Assistant:

static tcu::Interval fma (glu::Precision precision, float a, float b, float c)
	{
		const tcu::FloatFormat formats[] =
		{
			//				 minExp		maxExp		mantissa	exact,		subnormals	infinities	NaN
			tcu::FloatFormat(0,			0,			7,			false,		tcu::YES,	tcu::MAYBE,	tcu::MAYBE),
			tcu::FloatFormat(-13,		13,			9,			false,		tcu::MAYBE,	tcu::MAYBE,	tcu::MAYBE),
			tcu::FloatFormat(-126,		127,		23,			true,		tcu::MAYBE, tcu::YES,	tcu::MAYBE)
		};
		const tcu::FloatFormat&	format	= de::getSizedArrayElement<glu::PRECISION_LAST>(formats, precision);
		const tcu::Interval		ia		= format.convert(a);
		const tcu::Interval		ib		= format.convert(b);
		const tcu::Interval		ic		= format.convert(c);
		tcu::Interval			prod0;
		tcu::Interval			prod1;
		tcu::Interval			prod2;
		tcu::Interval			prod3;
		tcu::Interval			prod;
		tcu::Interval			res;

		TCU_SET_INTERVAL(prod0, tmp, tmp = ia.lo() * ib.lo());
		TCU_SET_INTERVAL(prod1, tmp, tmp = ia.lo() * ib.hi());
		TCU_SET_INTERVAL(prod2, tmp, tmp = ia.hi() * ib.lo());
		TCU_SET_INTERVAL(prod3, tmp, tmp = ia.hi() * ib.hi());

		prod = format.convert(format.roundOut(prod0 | prod1 | prod2 | prod3, ia.isFinite() && ib.isFinite()));

		TCU_SET_INTERVAL_BOUNDS(res, tmp,
								tmp = prod.lo() + ic.lo(),
								tmp = prod.hi() + ic.hi());

		return format.convert(format.roundOut(res, prod.isFinite() && ic.isFinite()));
	}